

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_options.c
# Opt level: O0

void xx(OnigOptionType options,char *pattern,char *str,int from,int to,int mem,int not,int error_no,
       int line_no)

{
  OnigUChar *pOVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined1 local_118 [8];
  char s_1 [90];
  char s [90];
  undefined1 local_50 [8];
  OnigErrorInfo einfo;
  regex_t *reg;
  int r;
  int mem_local;
  int to_local;
  int from_local;
  char *str_local;
  char *pattern_local;
  OnigOptionType options_local;
  
  sVar3 = strlen(pattern);
  puVar5 = local_50;
  uVar2 = onig_new(&einfo.par_end,pattern,pattern + sVar3,options,&OnigEncodingUTF8,
                   _OnigDefaultSyntax,puVar5);
  pOVar1 = einfo.par_end;
  uVar7 = (undefined4)((ulong)puVar5 >> 0x20);
  if (uVar2 == 0) {
    sVar3 = strlen(str);
    sVar4 = strlen(str);
    uVar6 = CONCAT44(uVar7,options);
    uVar2 = onig_search(pOVar1,str,str + sVar3,str,str + sVar4,region,uVar6);
    uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
    if (((int)uVar2 < -1) || (error_no < -1)) {
      if (error_no == 0) {
        onig_error_code_to_str(local_118,uVar2);
        fprintf((FILE *)err_file,"ERROR: %s  /%s/  #%d\n",local_118,pattern,(ulong)(uint)line_no);
        nerror = nerror + 1;
      }
      else if (uVar2 == error_no) {
        fprintf(_stdout,"OK(ERROR): /%s/ \'%s\', %d  #%d\n",pattern,str,(ulong)uVar2,
                (ulong)(uint)line_no);
        nsucc = nsucc + 1;
      }
      else {
        fprintf(_stdout,"FAIL ERROR NO: /%s/ \'%s\', %d, %d  #%d\n",pattern,str,
                (ulong)(uint)error_no,(ulong)uVar2,CONCAT44(uVar7,line_no));
        nfail = nfail + 1;
      }
    }
    else {
      if (uVar2 == 0xffffffff) {
        if (not == 0) {
          fprintf(_stdout,"FAIL: /%s/ \'%s\'  #%d\n",pattern,str,(ulong)(uint)line_no);
          nfail = nfail + 1;
        }
        else {
          fprintf(_stdout,"OK(N): /%s/ \'%s\'  #%d\n",pattern,str,(ulong)(uint)line_no);
          nsucc = nsucc + 1;
        }
      }
      else if (not == 0) {
        if ((region->beg[mem] == from) && (region->end[mem] == to)) {
          fprintf(_stdout,"OK: /%s/ \'%s\'  #%d\n",pattern,str,(ulong)(uint)line_no);
          nsucc = nsucc + 1;
        }
        else {
          fprintf(_stdout,"FAIL: /%s/ \'%s\' %d-%d : %d-%d  #%d\n",pattern,str,(ulong)(uint)from,
                  (ulong)(uint)to,CONCAT44(uVar7,region->beg[mem]),region->end[mem],line_no);
          nfail = nfail + 1;
        }
      }
      else {
        fprintf(_stdout,"FAIL(N): /%s/ \'%s\'  #%d\n",pattern,str,(ulong)(uint)line_no);
        nfail = nfail + 1;
      }
      onig_free(einfo.par_end);
    }
  }
  else if (error_no == 0) {
    onig_error_code_to_str(s_1 + 0x58,uVar2,local_50);
    fprintf((FILE *)err_file,"ERROR: %s  /%s/  #%d\n",s_1 + 0x58,pattern,(ulong)(uint)line_no);
    nerror = nerror + 1;
  }
  else if (uVar2 == error_no) {
    fprintf(_stdout,"OK(ERROR): /%s/ %d  #%d\n",pattern,(ulong)uVar2,(ulong)(uint)line_no);
    nsucc = nsucc + 1;
  }
  else {
    fprintf(_stdout,"FAIL(ERROR): /%s/ \'%s\', %d, %d  #%d\n",pattern,str,(ulong)(uint)error_no,
            (ulong)uVar2,CONCAT44(uVar7,line_no));
    nfail = nfail + 1;
  }
  return;
}

Assistant:

static void xx(OnigOptionType options, char* pattern, char* str,
               int from, int to, int mem, int not, int error_no, int line_no)
{
#ifdef __TRUSTINSOFT_ANALYZER__
  if (nall++ % TIS_TEST_CHOOSE_MAX != TIS_TEST_CHOOSE_CURRENT) return;
#endif

  int r;
  regex_t* reg;
  OnigErrorInfo einfo;

  r = onig_new(&reg, (UChar* )pattern, (UChar* )(pattern + SLEN(pattern)),
         options, ONIG_ENCODING_UTF8, ONIG_SYNTAX_DEFAULT, &einfo);
  if (r) {
    char s[ONIG_MAX_ERROR_MESSAGE_LEN];

    if (error_no == 0) {
      onig_error_code_to_str((UChar* )s, r, &einfo);
      fprintf(err_file, "ERROR: %s  /%s/  #%d\n", s, pattern, line_no);
      nerror++;
    }
    else {
      if (r == error_no) {
        fprintf(stdout, "OK(ERROR): /%s/ %d  #%d\n", pattern, r, line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL(ERROR): /%s/ '%s', %d, %d  #%d\n", pattern, str,
                error_no, r, line_no);
        nfail++;
      }
    }

    return ;
  }

  r = onig_search(reg, (UChar* )str, (UChar* )(str + SLEN(str)),
                  (UChar* )str, (UChar* )(str + SLEN(str)),
                  region, options);
  if (r < ONIG_MISMATCH || error_no < ONIG_MISMATCH) {
    char s[ONIG_MAX_ERROR_MESSAGE_LEN];

    if (error_no == 0) {
      onig_error_code_to_str((UChar* )s, r);
      fprintf(err_file, "ERROR: %s  /%s/  #%d\n", s, pattern, line_no);
      nerror++;
    }
    else {
      if (r == error_no) {
        fprintf(stdout, "OK(ERROR): /%s/ '%s', %d  #%d\n",
                pattern, str, r, line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL ERROR NO: /%s/ '%s', %d, %d  #%d\n",
                pattern, str, error_no, r, line_no);
        nfail++;
      }
    }

    return ;
  }

  if (r == ONIG_MISMATCH) {
    if (not) {
      fprintf(stdout, "OK(N): /%s/ '%s'  #%d\n", pattern, str, line_no);
      nsucc++;
    }
    else {
      fprintf(stdout, "FAIL: /%s/ '%s'  #%d\n", pattern, str, line_no);
      nfail++;
    }
  }
  else {
    if (not) {
      fprintf(stdout, "FAIL(N): /%s/ '%s'  #%d\n", pattern, str, line_no);
      nfail++;
    }
    else {
      if (region->beg[mem] == from && region->end[mem] == to) {
        fprintf(stdout, "OK: /%s/ '%s'  #%d\n", pattern, str, line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL: /%s/ '%s' %d-%d : %d-%d  #%d\n", pattern, str,
                from, to, region->beg[mem], region->end[mem], line_no);
        nfail++;
      }
    }
  }
  onig_free(reg);
}